

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# info.c
# Opt level: O0

void printIdentifier(ktx_uint8_t *identifier,_Bool json)

{
  int iVar1;
  ulong uVar2;
  char *__format;
  byte in_SIL;
  long in_RDI;
  uint32_t nchars;
  uint32_t i;
  char u8identifier [30];
  uint32_t idlen;
  uint local_3c;
  char local_38 [40];
  uint local_10;
  byte local_9;
  long local_8;
  
  local_9 = in_SIL & 1;
  local_10 = 0;
  local_8 = in_RDI;
  for (local_3c = 0; local_3c < 0xc && local_10 < 0x1e; local_3c = local_3c + 1) {
    if (*(char *)(local_8 + (ulong)local_3c) == -0x55) {
      uVar2 = (ulong)local_10;
      local_10 = local_10 + 1;
      local_38[uVar2] = -0x3e;
      local_38[local_10] = *(char *)(local_8 + (ulong)local_3c);
    }
    else if (*(char *)(local_8 + (ulong)local_3c) == -0x45) {
      uVar2 = (ulong)local_10;
      local_10 = local_10 + 1;
      local_38[uVar2] = -0x3e;
      local_38[local_10] = *(char *)(local_8 + (ulong)local_3c);
    }
    else if (*(byte *)(local_8 + (ulong)local_3c) < 0x20) {
      if (*(char *)(local_8 + (ulong)local_3c) == '\n') {
        uVar2 = (ulong)local_10;
        local_10 = local_10 + 1;
        local_38[uVar2] = '\\';
        local_38[local_10] = 'n';
      }
      else if (*(char *)(local_8 + (ulong)local_3c) == '\r') {
        uVar2 = (ulong)local_10;
        local_10 = local_10 + 1;
        local_38[uVar2] = '\\';
        local_38[local_10] = 'r';
      }
      else {
        __format = "\\x%02X";
        if ((local_9 & 1) != 0) {
          __format = "\\u%04X";
        }
        iVar1 = snprintf(local_38 + local_10,0x1e - (ulong)local_10,__format,
                         (ulong)*(byte *)(local_8 + (ulong)local_3c));
        local_10 = iVar1 + -1 + local_10;
      }
    }
    else {
      local_38[local_10] = *(char *)(local_8 + (ulong)local_3c);
    }
    local_10 = local_10 + 1;
  }
  fprintf(_stdout,"%.*s",(ulong)local_10,local_38);
  return;
}

Assistant:

void
printIdentifier(const ktx_uint8_t identifier[12], bool json)
{
    // Convert identifier for better display.
    uint32_t idlen = 0;
    char u8identifier[30];
    for (uint32_t i = 0; i < 12 && idlen < sizeof(u8identifier); i++, idlen++) {
        // Convert the angle brackets to utf-8 for better printing. The
        // conversion below only works for characters whose msb's are 10.
        if (identifier[i] == U'\xAB') {
            u8identifier[idlen++] = '\xc2';
            u8identifier[idlen] = identifier[i];
        } else if (identifier[i] == U'\xBB') {
            u8identifier[idlen++] = '\xc2';
            u8identifier[idlen] = identifier[i];
        } else if (identifier[i] < '\x20') {
            uint32_t nchars;
            switch (identifier[i]) {
            case '\n':
                u8identifier[idlen++] = '\\';
                u8identifier[idlen] = 'n';
                break;
            case '\r':
                u8identifier[idlen++] = '\\';
                u8identifier[idlen] = 'r';
                break;
            default:
                nchars = snprintf(&u8identifier[idlen],
                                  sizeof(u8identifier) - idlen,
                                  json ? "\\u%04X" : "\\x%02X",
                                  identifier[i]);
                idlen += nchars - 1;
            }
        } else {
            u8identifier[idlen] = identifier[i];
        }
    }
#if defined(_WIN32)
    if (_isatty(_fileno(stdout)))
        SetConsoleOutputCP(CP_UTF8);
#endif
    fprintf(stdout, "%.*s", idlen, u8identifier);
}